

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int close_set_error(CLOSE_HANDLE close,ERROR_HANDLE error_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (close == (CLOSE_HANDLE)0x0) {
    iVar2 = 0x2762;
  }
  else {
    iVar2 = 0x276a;
    if (error_value != (ERROR_HANDLE)0x0) {
      item_value = amqpvalue_clone(error_value->composite_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(close->composite_value,0,item_value);
        iVar2 = 0x2770;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int close_set_error(CLOSE_HANDLE close, ERROR_HANDLE error_value)
{
    int result;

    if (close == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close;
        AMQP_VALUE error_amqp_value = amqpvalue_create_error(error_value);
        if (error_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(close_instance->composite_value, 0, error_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(error_amqp_value);
        }
    }

    return result;
}